

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<char16_t>::Clear(CharSet<char16_t> *this,ArenaAllocator *allocator)

{
  CharSetNode *pCVar1;
  int i;
  long lVar2;
  
  pCVar1 = (this->rep).full.root;
  if ((CharSetNode *)0x5 < pCVar1) {
    (**pCVar1->_vptr_CharSetNode)();
  }
  (this->rep).compact.countPlusOne = 1;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    *(undefined4 *)((long)&this->rep + lVar2 * 4 + 8) = 0xffffffff;
  }
  return;
}

Assistant:

void CharSet<char16>::Clear(ArenaAllocator* allocator)
    {
        if (!IsCompact() && rep.full.root != nullptr)
            rep.full.root->FreeSelf(allocator);
        rep.compact.countPlusOne = 1;
        for (int i = 0; i < MaxCompact; i++)
            rep.compact.cs[i] = emptySlot;
    }